

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O3

int namingConventions::namingConventionsClasses
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *inputFiles)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  Pda *this;
  Pda *this_00;
  pointer pbVar4;
  istream *piVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  string name;
  string word;
  string line;
  vector<Pda_*,_std::allocator<Pda_*>_> classPdas;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oldclassNames;
  string cl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newclassNames;
  stringstream stream;
  fstream buffer;
  string local_568;
  string local_548;
  string local_528;
  undefined1 *local_508;
  undefined8 local_500;
  undefined1 local_4f8;
  undefined7 uStack_4f7;
  vector<Pda_*,_std::allocator<Pda_*>_> local_4e8;
  string local_4c8;
  undefined1 local_4a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  undefined8 local_478;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_468;
  pointer local_460;
  pointer local_458;
  Pda *local_450;
  string local_448;
  string local_428;
  string local_408;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  stringstream local_3c8 [128];
  ios_base local_348 [264];
  long local_240 [66];
  
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"class","");
  this = makeNamePda(&local_448);
  this_00 = (Pda *)operator_new(0x90);
  Pda::Pda(this_00);
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_408,"vbn/NamingConvTests/classChecker.json","");
  Pda::readJson(this_00,&local_408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  local_450 = this_00;
  std::fstream::fstream(local_240);
  local_488._M_allocated_capacity = 0;
  local_488._8_8_ = 0;
  local_478 = 0;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e8.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4e8.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_4e8.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pbVar4 = (inputFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_460 = (inputFiles->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_468 = inputFiles;
  if (pbVar4 != local_460) {
    do {
      local_458 = pbVar4;
      std::fstream::open((char *)local_240,(_Ios_Openmode)(pbVar4->_M_dataplus)._M_p);
      local_508 = &local_4f8;
      local_500 = 0;
      local_4f8 = 0;
      while( true ) {
        cVar1 = std::ios::widen((char)*(undefined8 *)(local_240[0] + -0x18) +
                                (char)(istream *)local_240);
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_240,(string *)&local_508,cVar1);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        std::__cxx11::stringstream::stringstream(local_3c8,(string *)&local_508,_S_out|_S_in);
        local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
        local_548._M_string_length = 0;
        local_548.field_2._M_local_buf[0] = '\0';
        bVar2 = false;
        while (piVar5 = std::operator>>((istream *)local_3c8,(string *)&local_548),
              ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
          if (bVar2 != false) {
            findClassName(&local_568,&local_548);
            local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_528,local_568._M_dataplus._M_p,
                       local_568._M_dataplus._M_p + local_568._M_string_length);
            bVar2 = Pda::traverse(local_450,&local_528);
            if (bVar2) {
              uVar6 = local_528.field_2._M_allocated_capacity;
              _Var7._M_p = local_528._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_528._M_dataplus._M_p != &local_528.field_2) {
LAB_001079f8:
                operator_delete(_Var7._M_p,uVar6 + 1);
              }
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_568);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_528._M_dataplus._M_p != &local_528.field_2) {
                operator_delete(local_528._M_dataplus._M_p,
                                local_528.field_2._M_allocated_capacity + 1);
              }
              if (iVar3 != 0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_488,&local_568);
                local_4a8._0_8_ = makeNamePda(&local_568);
                std::vector<Pda*,std::allocator<Pda*>>::emplace_back<Pda*>
                          ((vector<Pda*,std::allocator<Pda*>> *)&local_4e8,(Pda **)local_4a8);
                local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4c8,local_568._M_dataplus._M_p,
                           local_568._M_dataplus._M_p + local_568._M_string_length);
                correctClassName((string *)local_4a8,&local_4c8);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_3e8,(string *)local_4a8);
                if ((Pda *)local_4a8._0_8_ != (Pda *)(local_4a8 + 0x10)) {
                  operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
                }
                uVar6 = local_4c8.field_2._M_allocated_capacity;
                _Var7._M_p = local_4c8._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) goto LAB_001079f8;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_568._M_dataplus._M_p != &local_568.field_2) {
              operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1
                             );
            }
          }
          local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_428,local_548._M_dataplus._M_p,
                     local_548._M_dataplus._M_p + local_548._M_string_length);
          bVar2 = Pda::traverse(this,&local_428);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p != &local_428.field_2) {
            operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,
                          CONCAT71(local_548.field_2._M_allocated_capacity._1_7_,
                                   local_548.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_3c8);
        std::ios_base::~ios_base(local_348);
      }
      std::fstream::close();
      if (local_508 != &local_4f8) {
        operator_delete(local_508,CONCAT71(uStack_4f7,local_4f8) + 1);
      }
      pbVar4 = local_458 + 1;
    } while (pbVar4 != local_460);
  }
  adjustForAllFiles(local_468,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_488,&local_4e8,true);
  if (local_4e8.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4e8.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4e8.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4e8.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_488);
  std::fstream::~fstream(local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int namingConventions::namingConventionsClasses(const std::vector<std::string> &inputFiles) {
    std::string cl = "class";
    Pda *classRecognizer = makeNamePda(cl);
    Pda *classChecker = new Pda();
    classChecker->readJson("vbn/NamingConvTests/classChecker.json");
    std::fstream buffer;
    std::vector<std::string> oldclassNames;
    std::vector<std::string> newclassNames;
    std::vector<Pda *> classPdas;


// loop over files om alle classes te bepalen en een verbeterde versie hiervan op te slaan
    for (auto &file: inputFiles) {
        buffer.open(file.c_str());
        std::string line;
        while (std::getline(buffer, line)) {
            bool found = false;
            std::stringstream stream(line);
            std::string word;
            while (stream >> word) {
                if (found) {
                    std::string name = findClassName(word);
                    if (!classChecker->traverse(name) && name != "") {
                        oldclassNames.push_back(name);
                        classPdas.push_back(makeNamePda(name));
                        newclassNames.push_back(correctClassName(name));
                        found = false;

                    } else {
                        found = false;
                    }
                }
                if (classRecognizer->traverse(word)) {
                    found = true;
                }

            }

        }
        buffer.close();
    }
    adjustForAllFiles(inputFiles, oldclassNames, classPdas, true);
    return 0;

}